

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_tracing_helpers.hpp
# Opt level: O1

void so_5::impl::msg_tracing_helpers::details::
     make_trace_to<std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::impl::msg_tracing_helpers::details::text_separator,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
               (ostream *s,type_index *a,intrusive_ptr_t<so_5::message_t> *other,
               text_separator *other_1,type_index *other_2,intrusive_ptr_t<so_5::message_t> *other_3
               )

{
  size_t sVar1;
  char *__s;
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"[msg_type=",10);
  __s = *(char **)(a->_M_target + 8) + (**(char **)(a->_M_target + 8) == '*');
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(s,__s,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>(s,"]",1);
  make_trace_to_1(s,other);
  make_trace_to<so_5::impl::msg_tracing_helpers::details::text_separator,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
            (s,other_1,other_2,other_3);
  return;
}

Assistant:

void
make_trace_to( std::ostream & s, A && a, OTHER &&... other )
	{
		make_trace_to_1( s, std::forward< A >(a) );
		make_trace_to( s, std::forward< OTHER >(other)... );
	}